

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcLightSource::~IfcLightSource(IfcLightSource *this)

{
  ~IfcLightSource((IfcLightSource *)&this[-1].Intensity.have);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}